

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

void Imf_3_3::calculateBytesPerLine
               (Header *header,char *sampleCountBase,int sampleCountXStride,int sampleCountYStride,
               int minX,int maxX,int minY,int maxY,vector<int,_std::allocator<int>_> *xOffsets,
               vector<int,_std::allocator<int>_> *yOffsets,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  int *piVar6;
  reference pvVar7;
  int in_ECX;
  int in_EDX;
  char *in_RSI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int x;
  int y;
  int i;
  int yOffset;
  int xOffset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000028;
  ConstIterator c;
  int pos;
  ChannelList *channels;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  ConstIterator *in_stack_ffffffffffffffa0;
  int local_54;
  int local_50;
  PixelType type;
  int local_2c;
  
  Header::channels((Header *)0x16d1fa);
  local_2c = 0;
  ChannelList::begin((ChannelList *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    ChannelList::end((ChannelList *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar3 = operator!=(in_stack_ffffffffffffffa0,
                       (ConstIterator *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar3) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](_y,(long)local_2c);
    iVar1 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](_yOffset,(long)local_2c);
    iVar2 = *pvVar5;
    type = UINT;
    for (local_50 = in_stack_00000008 - iVar2; local_50 <= in_stack_00000010 - iVar2;
        local_50 = local_50 + 1) {
      for (local_54 = in_R8D - iVar1; local_54 <= in_R9D - iVar1; local_54 = local_54 + 1) {
        piVar6 = sampleCount(in_RSI,in_EDX,in_ECX,local_54,local_50);
        in_stack_ffffffffffffff9c = *piVar6;
        ChannelList::ConstIterator::channel((ConstIterator *)0x16d2dc);
        iVar4 = pixelTypeSize(type);
        in_stack_ffffffffffffffa0 = (ConstIterator *)(long)(in_stack_ffffffffffffff9c * iVar4);
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_stack_00000028,(long)(int)type);
        *pvVar7 = (long)&(in_stack_ffffffffffffffa0->_i)._M_node + *pvVar7;
      }
      type = type + HALF;
    }
    ChannelList::ConstIterator::operator++(in_stack_ffffffffffffffa0);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void
calculateBytesPerLine (
    const Header&          header,
    char*                  sampleCountBase,
    int                    sampleCountXStride,
    int                    sampleCountYStride,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    std::vector<int>&      xOffsets,
    std::vector<int>&      yOffsets,
    std::vector<uint64_t>& bytesPerLine)
{
    const ChannelList& channels = header.channels ();

    int pos = 0;
    for (ChannelList::ConstIterator c = channels.begin (); c != channels.end ();
         ++c, ++pos)
    {
        int xOffset = xOffsets[pos];
        int yOffset = yOffsets[pos];
        int i       = 0;
        for (int y = minY - yOffset; y <= maxY - yOffset; y++, i++)
            for (int x = minX - xOffset; x <= maxX - xOffset; x++)
            {
                bytesPerLine[i] += sampleCount (
                                       sampleCountBase,
                                       sampleCountXStride,
                                       sampleCountYStride,
                                       x,
                                       y) *
                                   pixelTypeSize (c.channel ().type);
            }
    }
}